

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minihttp.cpp
# Opt level: O1

bool __thiscall minihttp::HttpSocket::IsRedirecting(HttpSocket *this)

{
  uint uVar1;
  
  uVar1 = this->_status - 0x12d;
  return (bool)(199U >> ((byte)uVar1 & 0x1f) & uVar1 < 8);
}

Assistant:

bool HttpSocket::IsRedirecting() const
{
    switch(_status)
    {
        case 301:
        case 302:
        case 303:
        case 307:
        case 308:
            return true;
    }
    return false;
}